

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O1

bool __thiscall zmq::ip_addr_t::is_multicast(ip_addr_t *this)

{
  bool bVar1;
  
  if ((this->generic).sa_family == 2) {
    bVar1 = ((this->ipv6).sin6_flowinfo & 0xf0) == 0xe0;
  }
  else {
    bVar1 = (this->generic).sa_data[6] == -1;
  }
  return bVar1;
}

Assistant:

bool zmq::ip_addr_t::is_multicast () const
{
    if (family () == AF_INET) {
        //  IPv4 Multicast: address MSBs are 1110
        //  Range: 224.0.0.0 - 239.255.255.255
        return IN_MULTICAST (ntohl (ipv4.sin_addr.s_addr));
    }
    //  IPv6 Multicast: ff00::/8
    return IN6_IS_ADDR_MULTICAST (&ipv6.sin6_addr) != 0;
}